

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void CumulativeSumToAverageRow_SSE2
               (int32_t *topleft,int32_t *botleft,int width,int area,uint8_t *dst,int count)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  bool bVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  int *piVar26;
  int *piVar27;
  int *piVar28;
  int *piVar29;
  int *piVar30;
  int *piVar31;
  int *piVar32;
  int *piVar33;
  int *piVar34;
  int *piVar35;
  int *piVar36;
  int *piVar37;
  int *piVar38;
  int *piVar39;
  int *piVar40;
  int *piVar41;
  int *piVar42;
  int *piVar43;
  int iVar44;
  int *piVar45;
  int *piVar46;
  int *piVar47;
  int *piVar48;
  int *piVar49;
  int *piVar50;
  int *piVar51;
  int *piVar52;
  int *piVar53;
  int *piVar54;
  int *piVar55;
  int *piVar56;
  long lVar57;
  int iVar58;
  int iVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 in_XMM4 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  int count_local;
  
  lVar57 = (long)width;
  fVar70 = (float)area;
  auVar69 = rcpss(in_XMM4,ZEXT416((uint)fVar70));
  fVar68 = auVar69._0_4_;
  iVar58 = count + -4;
  if (3 < count) {
    iVar59 = iVar58;
    if ((uint)area < 0x81) {
      auVar71._0_4_ = (int)((fVar70 + 65535.0) * fVar68);
      auVar71._4_4_ = (int)((fVar70 + 65535.0) * fVar68);
      auVar71._8_4_ = (int)((fVar70 + 65535.0) * fVar68);
      auVar71._12_4_ = (int)((fVar70 + 65535.0) * fVar68);
      auVar69 = packssdw(auVar71,auVar71);
      do {
        iVar58 = *topleft;
        piVar26 = topleft + 1;
        piVar27 = topleft + 2;
        piVar28 = topleft + 3;
        piVar1 = topleft + 4;
        piVar29 = topleft + 5;
        piVar30 = topleft + 6;
        piVar31 = topleft + 7;
        piVar2 = topleft + 8;
        piVar32 = topleft + 9;
        piVar33 = topleft + 10;
        piVar34 = topleft + 0xb;
        piVar3 = topleft + 0xc;
        piVar35 = topleft + 0xd;
        piVar36 = topleft + 0xe;
        piVar37 = topleft + 0xf;
        piVar4 = topleft + lVar57;
        piVar6 = topleft + lVar57 + 4;
        piVar7 = topleft + lVar57 + 8;
        piVar8 = topleft + lVar57 + 0xc;
        topleft = topleft + 0x10;
        piVar5 = botleft + lVar57;
        auVar60._0_4_ = ((iVar58 - *piVar4) - *botleft) + *piVar5;
        auVar60._4_4_ = ((*piVar26 - piVar4[1]) - botleft[1]) + piVar5[1];
        auVar60._8_4_ = ((*piVar27 - piVar4[2]) - botleft[2]) + piVar5[2];
        auVar60._12_4_ = ((*piVar28 - piVar4[3]) - botleft[3]) + piVar5[3];
        piVar4 = botleft + lVar57 + 4;
        auVar63._0_4_ = ((*piVar1 - *piVar6) - botleft[4]) + *piVar4;
        auVar63._4_4_ = ((*piVar29 - piVar6[1]) - botleft[5]) + piVar4[1];
        auVar63._8_4_ = ((*piVar30 - piVar6[2]) - botleft[6]) + piVar4[2];
        auVar63._12_4_ = ((*piVar31 - piVar6[3]) - botleft[7]) + piVar4[3];
        piVar1 = botleft + lVar57 + 8;
        auVar64._0_4_ = ((*piVar2 - *piVar7) - botleft[8]) + *piVar1;
        auVar64._4_4_ = ((*piVar32 - piVar7[1]) - botleft[9]) + piVar1[1];
        auVar64._8_4_ = ((*piVar33 - piVar7[2]) - botleft[10]) + piVar1[2];
        auVar64._12_4_ = ((*piVar34 - piVar7[3]) - botleft[0xb]) + piVar1[3];
        piVar1 = botleft + lVar57 + 0xc;
        auVar66._0_4_ = ((*piVar3 - *piVar8) - botleft[0xc]) + *piVar1;
        auVar66._4_4_ = ((*piVar35 - piVar8[1]) - botleft[0xd]) + piVar1[1];
        auVar66._8_4_ = ((*piVar36 - piVar8[2]) - botleft[0xe]) + piVar1[2];
        auVar66._12_4_ = ((*piVar37 - piVar8[3]) - botleft[0xf]) + piVar1[3];
        botleft = botleft + 0x10;
        auVar61 = packssdw(auVar60,auVar63);
        auVar65 = packssdw(auVar64,auVar66);
        auVar61 = pmulhuw(auVar61,auVar69);
        auVar65 = pmulhuw(auVar65,auVar69);
        sVar10 = auVar61._0_2_;
        sVar11 = auVar61._2_2_;
        sVar12 = auVar61._4_2_;
        sVar13 = auVar61._6_2_;
        sVar14 = auVar61._8_2_;
        sVar15 = auVar61._10_2_;
        sVar16 = auVar61._12_2_;
        sVar17 = auVar61._14_2_;
        sVar18 = auVar65._0_2_;
        sVar19 = auVar65._2_2_;
        sVar20 = auVar65._4_2_;
        sVar21 = auVar65._6_2_;
        sVar22 = auVar65._8_2_;
        sVar23 = auVar65._10_2_;
        sVar24 = auVar65._12_2_;
        sVar25 = auVar65._14_2_;
        *dst = (0 < sVar10) * (sVar10 < 0x100) * auVar61[0] - (0xff < sVar10);
        dst[1] = (0 < sVar11) * (sVar11 < 0x100) * auVar61[2] - (0xff < sVar11);
        dst[2] = (0 < sVar12) * (sVar12 < 0x100) * auVar61[4] - (0xff < sVar12);
        dst[3] = (0 < sVar13) * (sVar13 < 0x100) * auVar61[6] - (0xff < sVar13);
        dst[4] = (0 < sVar14) * (sVar14 < 0x100) * auVar61[8] - (0xff < sVar14);
        dst[5] = (0 < sVar15) * (sVar15 < 0x100) * auVar61[10] - (0xff < sVar15);
        dst[6] = (0 < sVar16) * (sVar16 < 0x100) * auVar61[0xc] - (0xff < sVar16);
        dst[7] = (0 < sVar17) * (sVar17 < 0x100) * auVar61[0xe] - (0xff < sVar17);
        dst[8] = (0 < sVar18) * (sVar18 < 0x100) * auVar65[0] - (0xff < sVar18);
        dst[9] = (0 < sVar19) * (sVar19 < 0x100) * auVar65[2] - (0xff < sVar19);
        dst[10] = (0 < sVar20) * (sVar20 < 0x100) * auVar65[4] - (0xff < sVar20);
        dst[0xb] = (0 < sVar21) * (sVar21 < 0x100) * auVar65[6] - (0xff < sVar21);
        dst[0xc] = (0 < sVar22) * (sVar22 < 0x100) * auVar65[8] - (0xff < sVar22);
        dst[0xd] = (0 < sVar23) * (sVar23 < 0x100) * auVar65[10] - (0xff < sVar23);
        dst[0xe] = (0 < sVar24) * (sVar24 < 0x100) * auVar65[0xc] - (0xff < sVar24);
        dst[0xf] = (0 < sVar25) * (sVar25 < 0x100) * auVar65[0xe] - (0xff < sVar25);
        dst = dst + 0x10;
        iVar58 = iVar59 + -4;
        bVar9 = 3 < iVar59;
        iVar59 = iVar58;
      } while (bVar9);
    }
    else {
      do {
        iVar58 = *topleft;
        piVar32 = topleft + 1;
        piVar33 = topleft + 2;
        piVar34 = topleft + 3;
        piVar1 = topleft + 4;
        piVar35 = topleft + 5;
        piVar36 = topleft + 6;
        piVar37 = topleft + 7;
        piVar2 = topleft + 8;
        piVar38 = topleft + 9;
        piVar39 = topleft + 10;
        piVar40 = topleft + 0xb;
        piVar3 = topleft + 0xc;
        piVar41 = topleft + 0xd;
        piVar42 = topleft + 0xe;
        piVar43 = topleft + 0xf;
        piVar7 = topleft + lVar57;
        piVar26 = topleft + lVar57 + 4;
        piVar27 = topleft + lVar57 + 8;
        piVar28 = topleft + lVar57 + 0xc;
        topleft = topleft + 0x10;
        iVar44 = *botleft;
        piVar45 = botleft + 1;
        piVar46 = botleft + 2;
        piVar47 = botleft + 3;
        piVar4 = botleft + 4;
        piVar48 = botleft + 5;
        piVar49 = botleft + 6;
        piVar50 = botleft + 7;
        piVar5 = botleft + 8;
        piVar51 = botleft + 9;
        piVar52 = botleft + 10;
        piVar53 = botleft + 0xb;
        piVar6 = botleft + 0xc;
        piVar54 = botleft + 0xd;
        piVar55 = botleft + 0xe;
        piVar56 = botleft + 0xf;
        piVar8 = botleft + lVar57;
        piVar29 = botleft + lVar57 + 4;
        piVar30 = botleft + lVar57 + 8;
        piVar31 = botleft + lVar57 + 0xc;
        botleft = botleft + 0x10;
        auVar69._0_4_ = (int)((float)(((iVar58 - *piVar7) - iVar44) + *piVar8) * fVar68);
        auVar69._4_4_ = (int)((float)(((*piVar32 - piVar7[1]) - *piVar45) + piVar8[1]) * fVar68);
        auVar69._8_4_ = (int)((float)(((*piVar33 - piVar7[2]) - *piVar46) + piVar8[2]) * fVar68);
        auVar69._12_4_ = (int)((float)(((*piVar34 - piVar7[3]) - *piVar47) + piVar8[3]) * fVar68);
        auVar61._0_4_ = (int)((float)(((*piVar1 - *piVar26) - *piVar4) + *piVar29) * fVar68);
        auVar61._4_4_ = (int)((float)(((*piVar35 - piVar26[1]) - *piVar48) + piVar29[1]) * fVar68);
        auVar61._8_4_ = (int)((float)(((*piVar36 - piVar26[2]) - *piVar49) + piVar29[2]) * fVar68);
        auVar61._12_4_ = (int)((float)(((*piVar37 - piVar26[3]) - *piVar50) + piVar29[3]) * fVar68);
        auVar65._0_4_ = (int)((float)(((*piVar2 - *piVar27) - *piVar5) + *piVar30) * fVar68);
        auVar65._4_4_ = (int)((float)(((*piVar38 - piVar27[1]) - *piVar51) + piVar30[1]) * fVar68);
        auVar65._8_4_ = (int)((float)(((*piVar39 - piVar27[2]) - *piVar52) + piVar30[2]) * fVar68);
        auVar65._12_4_ = (int)((float)(((*piVar40 - piVar27[3]) - *piVar53) + piVar30[3]) * fVar68);
        auVar67._0_4_ = (int)((float)(((*piVar3 - *piVar28) - *piVar6) + *piVar31) * fVar68);
        auVar67._4_4_ = (int)((float)(((*piVar41 - piVar28[1]) - *piVar54) + piVar31[1]) * fVar68);
        auVar67._8_4_ = (int)((float)(((*piVar42 - piVar28[2]) - *piVar55) + piVar31[2]) * fVar68);
        auVar67._12_4_ = (int)((float)(((*piVar43 - piVar28[3]) - *piVar56) + piVar31[3]) * fVar68);
        auVar69 = packssdw(auVar69,auVar61);
        auVar61 = packssdw(auVar65,auVar67);
        sVar10 = auVar69._0_2_;
        sVar11 = auVar69._2_2_;
        sVar12 = auVar69._4_2_;
        sVar13 = auVar69._6_2_;
        sVar14 = auVar69._8_2_;
        sVar15 = auVar69._10_2_;
        sVar16 = auVar69._12_2_;
        sVar17 = auVar69._14_2_;
        sVar18 = auVar61._0_2_;
        sVar19 = auVar61._2_2_;
        sVar20 = auVar61._4_2_;
        sVar21 = auVar61._6_2_;
        sVar22 = auVar61._8_2_;
        sVar23 = auVar61._10_2_;
        sVar24 = auVar61._12_2_;
        sVar25 = auVar61._14_2_;
        *dst = (0 < sVar10) * (sVar10 < 0x100) * auVar69[0] - (0xff < sVar10);
        dst[1] = (0 < sVar11) * (sVar11 < 0x100) * auVar69[2] - (0xff < sVar11);
        dst[2] = (0 < sVar12) * (sVar12 < 0x100) * auVar69[4] - (0xff < sVar12);
        dst[3] = (0 < sVar13) * (sVar13 < 0x100) * auVar69[6] - (0xff < sVar13);
        dst[4] = (0 < sVar14) * (sVar14 < 0x100) * auVar69[8] - (0xff < sVar14);
        dst[5] = (0 < sVar15) * (sVar15 < 0x100) * auVar69[10] - (0xff < sVar15);
        dst[6] = (0 < sVar16) * (sVar16 < 0x100) * auVar69[0xc] - (0xff < sVar16);
        dst[7] = (0 < sVar17) * (sVar17 < 0x100) * auVar69[0xe] - (0xff < sVar17);
        dst[8] = (0 < sVar18) * (sVar18 < 0x100) * auVar61[0] - (0xff < sVar18);
        dst[9] = (0 < sVar19) * (sVar19 < 0x100) * auVar61[2] - (0xff < sVar19);
        dst[10] = (0 < sVar20) * (sVar20 < 0x100) * auVar61[4] - (0xff < sVar20);
        dst[0xb] = (0 < sVar21) * (sVar21 < 0x100) * auVar61[6] - (0xff < sVar21);
        dst[0xc] = (0 < sVar22) * (sVar22 < 0x100) * auVar61[8] - (0xff < sVar22);
        dst[0xd] = (0 < sVar23) * (sVar23 < 0x100) * auVar61[10] - (0xff < sVar23);
        dst[0xe] = (0 < sVar24) * (sVar24 < 0x100) * auVar61[0xc] - (0xff < sVar24);
        dst[0xf] = (0 < sVar25) * (sVar25 < 0x100) * auVar61[0xe] - (0xff < sVar25);
        dst = dst + 0x10;
        iVar58 = iVar59 + -4;
        bVar9 = 3 < iVar59;
        iVar59 = iVar58;
      } while (bVar9);
    }
  }
  iVar59 = iVar58 + 3;
  if (SCARRY4(iVar58,3) == iVar58 + 3 < 0) {
    do {
      iVar58 = *topleft;
      piVar3 = topleft + 1;
      piVar4 = topleft + 2;
      piVar5 = topleft + 3;
      piVar1 = topleft + lVar57;
      topleft = topleft + 4;
      iVar44 = *botleft;
      piVar6 = botleft + 1;
      piVar7 = botleft + 2;
      piVar8 = botleft + 3;
      piVar2 = botleft + lVar57;
      botleft = botleft + 4;
      auVar62._0_4_ = (int)((float)(((iVar58 - *piVar1) - iVar44) + *piVar2) * fVar68);
      auVar62._4_4_ = (int)((float)(((*piVar3 - piVar1[1]) - *piVar6) + piVar2[1]) * fVar68);
      auVar62._8_4_ = (int)((float)(((*piVar4 - piVar1[2]) - *piVar7) + piVar2[2]) * fVar68);
      auVar62._12_4_ = (int)((float)(((*piVar5 - piVar1[3]) - *piVar8) + piVar2[3]) * fVar68);
      auVar69 = packssdw(auVar62,auVar62);
      sVar10 = auVar69._0_2_;
      sVar11 = auVar69._2_2_;
      sVar12 = auVar69._4_2_;
      sVar13 = auVar69._6_2_;
      *(uint *)dst = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar69[6] - (0xff < sVar13),
                              CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar69[4] -
                                       (0xff < sVar12),
                                       CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar69[2] -
                                                (0xff < sVar11),
                                                (0 < sVar10) * (sVar10 < 0x100) * auVar69[0] -
                                                (0xff < sVar10))));
      dst = dst + 4;
      bVar9 = 0 < iVar59;
      iVar59 = iVar59 + -1;
    } while (bVar9);
  }
  return;
}

Assistant:

void CumulativeSumToAverageRow_SSE2(const int32_t* topleft,
                                    const int32_t* botleft,
                                    int width,
                                    int area,
                                    uint8_t* dst,
                                    int count) {
  asm volatile(
      "movd        %5,%%xmm5                     \n"
      "cvtdq2ps    %%xmm5,%%xmm5                 \n"
      "rcpss       %%xmm5,%%xmm4                 \n"
      "pshufd      $0x0,%%xmm4,%%xmm4            \n"
      "sub         $0x4,%3                       \n"
      "jl          49f                           \n"
      "cmpl        $0x80,%5                      \n"
      "ja          40f                           \n"

      "pshufd      $0x0,%%xmm5,%%xmm5            \n"
      "pcmpeqb     %%xmm6,%%xmm6                 \n"
      "psrld       $0x10,%%xmm6                  \n"
      "cvtdq2ps    %%xmm6,%%xmm6                 \n"
      "addps       %%xmm6,%%xmm5                 \n"
      "mulps       %%xmm4,%%xmm5                 \n"
      "cvtps2dq    %%xmm5,%%xmm5                 \n"
      "packssdw    %%xmm5,%%xmm5                 \n"

      // 4 pixel small loop.
      LABELALIGN
      "4:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x20(%0),%%xmm2               \n"
      "movdqu      0x30(%0),%%xmm3               \n"
      "psubd       0x00(%0,%4,4),%%xmm0          \n"
      "psubd       0x10(%0,%4,4),%%xmm1          \n"
      "psubd       0x20(%0,%4,4),%%xmm2          \n"
      "psubd       0x30(%0,%4,4),%%xmm3          \n"
      "lea         0x40(%0),%0                   \n"
      "psubd       (%1),%%xmm0                   \n"
      "psubd       0x10(%1),%%xmm1               \n"
      "psubd       0x20(%1),%%xmm2               \n"
      "psubd       0x30(%1),%%xmm3               \n"
      "paddd       0x00(%1,%4,4),%%xmm0          \n"
      "paddd       0x10(%1,%4,4),%%xmm1          \n"
      "paddd       0x20(%1,%4,4),%%xmm2          \n"
      "paddd       0x30(%1,%4,4),%%xmm3          \n"
      "lea         0x40(%1),%1                   \n"
      "packssdw    %%xmm1,%%xmm0                 \n"
      "packssdw    %%xmm3,%%xmm2                 \n"
      "pmulhuw     %%xmm5,%%xmm0                 \n"
      "pmulhuw     %%xmm5,%%xmm2                 \n"
      "packuswb    %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x4,%3                       \n"
      "jge         4b                            \n"
      "jmp         49f                           \n"

      // 4 pixel loop
      LABELALIGN
      "40:                                       \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x20(%0),%%xmm2               \n"
      "movdqu      0x30(%0),%%xmm3               \n"
      "psubd       0x00(%0,%4,4),%%xmm0          \n"
      "psubd       0x10(%0,%4,4),%%xmm1          \n"
      "psubd       0x20(%0,%4,4),%%xmm2          \n"
      "psubd       0x30(%0,%4,4),%%xmm3          \n"
      "lea         0x40(%0),%0                   \n"
      "psubd       (%1),%%xmm0                   \n"
      "psubd       0x10(%1),%%xmm1               \n"
      "psubd       0x20(%1),%%xmm2               \n"
      "psubd       0x30(%1),%%xmm3               \n"
      "paddd       0x00(%1,%4,4),%%xmm0          \n"
      "paddd       0x10(%1,%4,4),%%xmm1          \n"
      "paddd       0x20(%1,%4,4),%%xmm2          \n"
      "paddd       0x30(%1,%4,4),%%xmm3          \n"
      "lea         0x40(%1),%1                   \n"
      "cvtdq2ps    %%xmm0,%%xmm0                 \n"
      "cvtdq2ps    %%xmm1,%%xmm1                 \n"
      "mulps       %%xmm4,%%xmm0                 \n"
      "mulps       %%xmm4,%%xmm1                 \n"
      "cvtdq2ps    %%xmm2,%%xmm2                 \n"
      "cvtdq2ps    %%xmm3,%%xmm3                 \n"
      "mulps       %%xmm4,%%xmm2                 \n"
      "mulps       %%xmm4,%%xmm3                 \n"
      "cvtps2dq    %%xmm0,%%xmm0                 \n"
      "cvtps2dq    %%xmm1,%%xmm1                 \n"
      "cvtps2dq    %%xmm2,%%xmm2                 \n"
      "cvtps2dq    %%xmm3,%%xmm3                 \n"
      "packssdw    %%xmm1,%%xmm0                 \n"
      "packssdw    %%xmm3,%%xmm2                 \n"
      "packuswb    %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x4,%3                       \n"
      "jge         40b                           \n"

      "49:                                       \n"
      "add         $0x3,%3                       \n"
      "jl          19f                           \n"

      // 1 pixel loop
      LABELALIGN
      "10:                                       \n"
      "movdqu      (%0),%%xmm0                   \n"
      "psubd       0x00(%0,%4,4),%%xmm0          \n"
      "lea         0x10(%0),%0                   \n"
      "psubd       (%1),%%xmm0                   \n"
      "paddd       0x00(%1,%4,4),%%xmm0          \n"
      "lea         0x10(%1),%1                   \n"
      "cvtdq2ps    %%xmm0,%%xmm0                 \n"
      "mulps       %%xmm4,%%xmm0                 \n"
      "cvtps2dq    %%xmm0,%%xmm0                 \n"
      "packssdw    %%xmm0,%%xmm0                 \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "movd        %%xmm0,(%2)                   \n"
      "lea         0x4(%2),%2                    \n"
      "sub         $0x1,%3                       \n"
      "jge         10b                           \n"
      "19:                                       \n"
      : "+r"(topleft),           // %0
        "+r"(botleft),           // %1
        "+r"(dst),               // %2
        "+rm"(count)             // %3
      : "r"((intptr_t)(width)),  // %4
        "rm"(area)               // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}